

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void __thiscall
Fossilize::StateRecorder::Impl::register_module_identifier
          (Impl *this,VkShaderModule module,
          VkPipelineShaderStageModuleIdentifierCreateInfoEXT *ident)

{
  uint uVar1;
  mapped_type *ppVVar2;
  undefined1 local_60 [8];
  VkShaderModuleIdentifierEXT m;
  uint64_t hash;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *ident_local;
  VkShaderModule module_local;
  Impl *this_local;
  
  if (((((this->record_data).write_database_entries & 1U) != 0) &&
      (this->module_identifier_database_iface != (DatabaseInterface *)0x0)) &&
     (ident->identifierSize != 0)) {
    m._48_8_ = module;
    uVar1 = (*this->module_identifier_database_iface->_vptr_DatabaseInterface[5])
                      (this->module_identifier_database_iface,4,module);
    if ((uVar1 & 1) == 0) {
      (*this->module_identifier_database_iface->_vptr_DatabaseInterface[4])
                (this->module_identifier_database_iface,4,m._48_8_,ident->pIdentifier,
                 (ulong)ident->identifierSize,8);
      memset(local_60,0,0x38);
      local_60._0_4_ = VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT;
      m.pNext._0_4_ = ident->identifierSize;
      memcpy((void *)((long)&m.pNext + 4),ident->pIdentifier,(ulong)ident->identifierSize);
      ppVVar2 = std::
                unordered_map<VkShaderModuleIdentifierEXT,_VkShaderModule_T_*,_std::hash<VkShaderModuleIdentifierEXT>,_std::equal_to<VkShaderModuleIdentifierEXT>,_std::allocator<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>_>_>
                ::operator[](&this->identifier_to_module,(key_type *)local_60);
      *ppVVar2 = module;
    }
  }
  return;
}

Assistant:

void StateRecorder::Impl::register_module_identifier(
		VkShaderModule module, const VkPipelineShaderStageModuleIdentifierCreateInfoEXT &ident)
{
	auto hash = (uint64_t)module;
	if (record_data.write_database_entries &&
	    module_identifier_database_iface &&
	    ident.identifierSize && !module_identifier_database_iface->has_entry(RESOURCE_SHADER_MODULE, hash))
	{
		module_identifier_database_iface->write_entry(
				RESOURCE_SHADER_MODULE, hash, ident.pIdentifier, ident.identifierSize,
				PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT);

		VkShaderModuleIdentifierEXT m = { VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT };
		m.identifierSize = ident.identifierSize;
		memcpy(m.identifier, ident.pIdentifier, ident.identifierSize);
		identifier_to_module[m] = module;
	}
}